

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_int.hpp
# Opt level: O2

uint32_t __thiscall
ans_int_decode::decode_sym<dec_entry_int>(ans_int_decode *this,uint64_t *state,uint8_t **in_u8)

{
  pointer puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  long lVar4;
  
  puVar1 = (this->table).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (this->frame_mask & *state) * 0xc;
  uVar3 = (ulong)*(uint *)(puVar1 + lVar4 + 4) +
          (*state >> ((ulong)(byte)this->frame_log2 & 0x3f)) * (ulong)*(uint *)(puVar1 + lVar4);
  *state = uVar3;
  if (uVar3 < this->lower_bound) {
    puVar2 = *in_u8;
    *in_u8 = puVar2 + -4;
    *state = (ulong)*(uint *)(puVar2 + -4) | uVar3 << 0x20;
  }
  return *(uint32_t *)(puVar1 + lVar4 + 8);
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        auto tbl = reinterpret_cast<const t_entry*>(table.data());
        const auto& entry = tbl[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        return entry.sym;
    }